

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

int __thiscall OpenMD::COHZ::computeProperty1(COHZ *this,int frame,Molecule *mol)

{
  pointer pvVar1;
  int zBin;
  Vector3d pos;
  RotMat3x3d A;
  
  StuntDouble::getA(&A,&(*(mol->rigidBodies_).
                          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_StuntDouble);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back((this->rotMats_).
            super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + frame,&A);
  Molecule::getCom(&pos,mol);
  if ((((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.info_)->simParams_->
      UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
    Snapshot::wrapVector
              ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.currentSnapshot_,&pos);
  }
  zBin = (int)(((this->halfBoxZ_ + pos.super_Vector<double,_3U>.data_[(uint)this->axis_]) *
               (double)this->nZBins_) / this->boxZ_);
  std::vector<int,_std::allocator<int>_>::push_back
            ((this->zbin_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame,&zBin);
  pvVar1 = (this->rotMats_).
           super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)(((long)*(pointer *)
                       ((long)&pvVar1[frame].
                               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                               ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar1[frame].
                         super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                         ._M_impl.super__Vector_impl_data) / 0x48) + -1;
}

Assistant:

int COHZ::computeProperty1(int frame, Molecule* mol) {
    RotMat3x3d A = mol->getRigidBodyAt(0)->getA();
    rotMats_[frame].push_back(A);

    Vector3d pos = mol->getCom();
    if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
      currentSnapshot_->wrapVector(pos);
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / boxZ_);
    zbin_[frame].push_back(zBin);

    return rotMats_[frame].size() - 1;
  }